

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O2

void __thiscall RegressionTree::run(RegressionTree *this)

{
  std::operator<<((ostream *)&std::cout,"Starting Regression Tree - Run() \n");
  loadFeatures(this);
  std::operator<<((ostream *)&std::cout,"Loaded Feautres \n");
  computeCandidates(this);
  std::operator<<((ostream *)&std::cout,"Computed Candidates \n");
  if (this->_classification == true) {
    classificationTreeQueries(this);
  }
  else {
    regressionTreeQueries(this);
  }
  QueryCompiler::compile
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  return;
}

Assistant:

void RegressionTree::run()
{
    cout << "Starting Regression Tree - Run() \n";

    loadFeatures();

    cout << "Loaded Feautres \n";

    computeCandidates();

    cout << "Computed Candidates \n";

    // genDynamicFunctions();

    if (_classification)
        classificationTreeQueries();
    else
        regressionTreeQueries();
    
    _compiler->compile();
}